

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_updateStats(optState_t *optPtr,U32 litLength,BYTE *literals,U32 offBase,U32 matchLength)

{
  int iVar1;
  U32 UVar2;
  uint uVar3;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 llCode;
  U32 u;
  U32 matchLength_local;
  U32 offBase_local;
  BYTE *literals_local;
  U32 litLength_local;
  optState_t *optPtr_local;
  
  iVar1 = ZSTD_compressedLiterals(optPtr);
  if (iVar1 != 0) {
    for (offCode = 0; offCode < litLength; offCode = offCode + 1) {
      optPtr->litFreq[literals[offCode]] = optPtr->litFreq[literals[offCode]] + 2;
    }
    optPtr->litSum = litLength * 2 + optPtr->litSum;
  }
  UVar2 = ZSTD_LLcode(litLength);
  optPtr->litLengthFreq[UVar2] = optPtr->litLengthFreq[UVar2] + 1;
  optPtr->litLengthSum = optPtr->litLengthSum + 1;
  uVar3 = ZSTD_highbit32(offBase);
  if (uVar3 < 0x20) {
    optPtr->offCodeFreq[uVar3] = optPtr->offCodeFreq[uVar3] + 1;
    optPtr->offCodeSum = optPtr->offCodeSum + 1;
    UVar2 = ZSTD_MLcode(matchLength - 3);
    optPtr->matchLengthFreq[UVar2] = optPtr->matchLengthFreq[UVar2] + 1;
    optPtr->matchLengthSum = optPtr->matchLengthSum + 1;
    return;
  }
  __assert_fail("offCode <= MaxOff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x174,"void ZSTD_updateStats(optState_t *const, U32, const BYTE *, U32, U32)");
}

Assistant:

static void ZSTD_updateStats(optState_t* const optPtr,
                             U32 litLength, const BYTE* literals,
                             U32 offBase, U32 matchLength)
{
    /* literals */
    if (ZSTD_compressedLiterals(optPtr)) {
        U32 u;
        for (u=0; u < litLength; u++)
            optPtr->litFreq[literals[u]] += ZSTD_LITFREQ_ADD;
        optPtr->litSum += litLength*ZSTD_LITFREQ_ADD;
    }

    /* literal Length */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        optPtr->litLengthFreq[llCode]++;
        optPtr->litLengthSum++;
    }

    /* offset code : follows storeSeq() numeric representation */
    {   U32 const offCode = ZSTD_highbit32(offBase);
        assert(offCode <= MaxOff);
        optPtr->offCodeFreq[offCode]++;
        optPtr->offCodeSum++;
    }

    /* match Length */
    {   U32 const mlBase = matchLength - MINMATCH;
        U32 const mlCode = ZSTD_MLcode(mlBase);
        optPtr->matchLengthFreq[mlCode]++;
        optPtr->matchLengthSum++;
    }
}